

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::STLImporter::pushMeshesToNode
          (STLImporter *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *meshIndices,
          aiNode *node)

{
  ulong uVar1;
  uint *puVar2;
  pointer puVar3;
  ulong uVar4;
  pointer puVar5;
  
  if (node != (aiNode *)0x0) {
    puVar3 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar3 != puVar5) {
      node->mNumMeshes = (uint)((ulong)((long)puVar5 - (long)puVar3) >> 2);
      uVar1 = (long)(meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0xffffffffffffffff;
      if (-1 < (long)uVar1) {
        uVar4 = uVar1;
      }
      puVar2 = (uint *)operator_new__(uVar4);
      node->mMeshes = puVar2;
      puVar3 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      if (puVar5 != puVar3) {
        uVar4 = 0;
        do {
          node->mMeshes[uVar4] = puVar3[uVar4];
          uVar4 = uVar4 + 1;
          puVar3 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          puVar5 = (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar4 < (ulong)((long)puVar5 - (long)puVar3 >> 2));
      }
      if (puVar5 != puVar3) {
        (meshIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
      }
    }
    return;
  }
  __assert_fail("nullptr != node",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/STL/STLLoader.cpp"
                ,0x239,
                "void Assimp::STLImporter::pushMeshesToNode(std::vector<unsigned int> &, aiNode *)")
  ;
}

Assistant:

void STLImporter::pushMeshesToNode( std::vector<unsigned int> &meshIndices, aiNode *node ) {
    ai_assert( nullptr != node );
    if ( meshIndices.empty() ) {
        return;
    }

    node->mNumMeshes = static_cast<unsigned int>( meshIndices.size() );
    node->mMeshes = new unsigned int[ meshIndices.size() ];
    for ( size_t i=0; i<meshIndices.size(); ++i ) {
        node->mMeshes[ i ] = meshIndices[ i ];
    }
    meshIndices.clear();
}